

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::update_h_scrollbar(Fl_Text_Display *this)

{
  int iVar1;
  int sliderMax;
  Fl_Text_Display *this_local;
  
  iVar1 = longest_vline(this);
  iVar1 = max(iVar1,(this->text_area).w + this->mHorizOffset);
  Fl_Scrollbar::value(this->mHScrollBar,this->mHorizOffset,(this->text_area).w,0,iVar1);
  return;
}

Assistant:

void Fl_Text_Display::update_h_scrollbar() {
  int sliderMax = max(longest_vline(), text_area.w + mHorizOffset);
  mHScrollBar->value( mHorizOffset, text_area.w, 0, sliderMax );
}